

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::FinalizeAllObjects
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  code *pcVar1;
  anon_class_16_2_093ebf5c fn;
  anon_class_16_2_093ebf5c_for_fn fn_00;
  bool bVar2;
  undefined4 *puVar3;
  uint local_14;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSStack_10;
  uint processedCount;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  if (this->finalizeCount != 0) {
    local_14 = 0;
    fn_00.processedCount = &local_14;
    fn_00.this = this;
    pSStack_10 = this;
    SmallHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachAllocatedObject<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::FinalizeAllObjects()::_lambda(unsigned_int,void*)_1_>
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,FinalizeBit,fn_00);
    fn.processedCount = &local_14;
    fn.this = this;
    ForEachPendingDisposeObject<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::FinalizeAllObjects()::_lambda(unsigned_int)_1_>
              (this,fn);
    if (this->finalizeCount != local_14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x24f,"(this->finalizeCount == processedCount)",
                         "this->finalizeCount == processedCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::FinalizeAllObjects()
{
    if (this->finalizeCount != 0)
    {
        DebugOnly(uint processedCount = 0);
        this->ForEachAllocatedObject(FinalizeBit, [&](uint index, void * objectAddress)
        {
            FinalizableObject * finalizableObject = ((FinalizableObject *)objectAddress);

            finalizableObject->Finalize(true);
            finalizableObject->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapBucket->heapInfo->liveFinalizableObjectCount --;
#endif
            DebugOnly(processedCount++);
        });

        this->ForEachPendingDisposeObject([&] (uint index) {
            void * objectAddress = this->address + (this->objectSize * index);
            ((FinalizableObject *)objectAddress)->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapBucket->heapInfo->liveFinalizableObjectCount--;
            this->heapBucket->heapInfo->pendingDisposableObjectCount--;
#endif
            DebugOnly(processedCount++);
        });

        Assert(this->finalizeCount == processedCount);
    }
}